

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

String * __thiscall
String::format<2ul>(String *__return_storage_ptr__,String *this,char *format,__va_list_tag *args)

{
  int iVar1;
  ulong len;
  char *__s;
  size_t size;
  undefined8 uStack_38;
  char buffer [2];
  va_list copy;
  __va_list_tag *args_local;
  char *format_local;
  String *ret;
  
  uStack_38 = *(undefined8 *)format;
  iVar1 = vsnprintf((char *)((long)&size + 6),2,(char *)this,format);
  len = (ulong)iVar1;
  String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
  if (len < 2) {
    assign(__return_storage_ptr__,(char *)((long)&size + 6),len);
  }
  else {
    resize(__return_storage_ptr__,len);
    __s = operator[](__return_storage_ptr__,0);
    vsnprintf(__s,len + 1,(char *)this,&stack0xffffffffffffffc8);
  }
  return __return_storage_ptr__;
}

Assistant:

static String format(const char *format, va_list args)
    {
        va_list copy;
        va_copy(copy, args);

        char buffer[StaticBufSize];
        const size_t size = ::vsnprintf(buffer, StaticBufSize, format, args);
        assert(size >= 0);
        String ret;
        if (size < StaticBufSize) {
            ret.assign(buffer, size);
        } else {
            ret.resize(size);
            ::vsnprintf(&ret[0], size+1, format, copy);
        }
        va_end(copy);
        return ret;
    }